

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool MomentChi2Test(HashInfo *info)

{
  double dVar1;
  long lVar2;
  undefined8 *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  longdouble lVar3;
  longdouble lVar4;
  double chi2;
  uint i_1;
  uint i;
  longdouble n;
  longdouble sbb;
  longdouble sb;
  longdouble saa;
  longdouble sa;
  uint mx;
  unsigned_long x;
  unsigned_long h;
  unsigned_long l;
  uint s;
  uint k;
  int step;
  int size;
  pfHash hash;
  byte local_d1;
  uint local_a0;
  uint local_9c;
  longdouble local_98;
  longdouble local_88;
  longdouble local_78;
  longdouble local_68;
  longdouble local_58;
  undefined4 local_44;
  long local_40;
  ulong local_38;
  ulong local_30;
  undefined4 local_28;
  undefined4 local_24;
  uint local_20;
  int local_1c;
  code *local_18;
  
  local_18 = (code *)*in_RDI;
  local_1c = *(int *)(in_RDI + 1) / 8;
  if (((local_18 == md5_32) || (local_18 == sha1_32a)) ||
     (local_d1 = 0, 0x80 < *(int *)(in_RDI + 1))) {
    local_d1 = g_testExtra ^ 0xff;
  }
  local_20 = (local_d1 & 1) * 3 + 3;
  local_24 = 0;
  local_28 = 0;
  local_44 = 0xfffffff0;
  local_88 = (longdouble)0;
  local_98 = (longdouble)(0xfffffff0 / (ulong)local_20);
  local_78 = local_88;
  local_68 = local_88;
  local_58 = local_88;
  (*local_18)(&local_24,4,0,&local_30);
  printf("Running 1st unseeded MomentChi2 for the low 32bits/step %d ... ",(ulong)local_20);
  fflush((FILE *)0x0);
  for (local_9c = 1; local_9c < 0xfffffff1; local_9c = local_20 + local_9c) {
    (*local_18)(&local_9c,4,local_28,&local_38);
    lVar2 = POPCOUNT(local_30 ^ local_38);
    local_40 = lVar2 * lVar2 * lVar2 * lVar2 * lVar2;
    local_58 = local_58 + (longdouble)0.0 + (longdouble)local_40;
    local_68 = local_68 +
               (longdouble)*(float *)(&DAT_00219010 + (ulong)(local_40 * local_40 < 0) * 4) +
               (longdouble)(local_40 * local_40);
    local_30 = local_38;
  }
  lVar3 = local_58 / local_98;
  lVar4 = (local_68 / local_98 - lVar3 * lVar3) / local_98;
  local_68 = lVar4;
  local_58 = lVar3;
  printf("%Lf - %Lf\n");
  printf("Running 2nd   seeded MomentChi2 for the low 32bits/step %d ... ",(ulong)local_20);
  fflush((FILE *)0x0);
  (*local_18)(&local_24,4,local_28,&local_30,in_R8,in_R9,lVar3,lVar4);
  for (local_a0 = 1; local_a0 < 0xfffffff1; local_a0 = local_20 + local_a0) {
    (*local_18)(&local_24,4,local_a0,&local_38);
    lVar2 = POPCOUNT(local_30 ^ local_38);
    local_40 = lVar2 * lVar2 * lVar2 * lVar2 * lVar2;
    local_78 = local_78 + (longdouble)0.0 + (longdouble)local_40;
    local_88 = local_88 +
               (longdouble)*(float *)(&DAT_00219010 + (ulong)(local_40 * local_40 < 0) * 4) +
               (longdouble)(local_40 * local_40);
    local_30 = local_38;
  }
  local_78 = local_78 / local_98;
  local_88 = (local_88 / local_98 - local_78 * local_78) / local_98;
  dVar1 = (double)(((local_58 - local_78) * (local_58 - local_78)) / (local_88 + local_68));
  printf("%Lf - %Lf\nKeySeedMomentChi2:\t%g\t",dVar1);
  fflush((FILE *)0x0);
  if (dVar1 <= 3.84145882069413) {
    printf("PASS\n");
    fflush((FILE *)0x0);
  }
  else {
    printf("FAIL!!!!\n");
    fflush((FILE *)0x0);
  }
  return dVar1 <= 3.84145882069413;
}

Assistant:

bool MomentChi2Test ( struct HashInfo *info )
{
  pfHash hash = info->hash;
  const int size = info->hashbits / 8;
  const int step = ((hash == md5_32 || hash == sha1_32a || info->hashbits > 128)
                    && !g_testExtra) ? 6 : 3;
  unsigned k = 0, s = 0;
  unsigned long l, h, x;
  const unsigned mx = 0xfffffff0;
  long double sa=0, saa=0, sb=0, sbb=0,	n = mx/step;
  hash(&k,sizeof(k),s,&l);
  printf("Running 1st unseeded MomentChi2 for the low 32bits/step %d ... ", step);
  fflush(NULL);
  for(unsigned i=1; i<=mx; i+=step){
    hash(&i,sizeof(i),s,&h);
    x = popcount8(l^h); // check the lower 32bits only
    x = x*x*x*x*x;
    sa+=x; saa+=x*x; l=h;
  }
  sa/=n; saa=(saa/n-sa*sa)/n;
  printf("%Lf - %Lf\n", sa, saa);
  printf("Running 2nd   seeded MomentChi2 for the low 32bits/step %d ... ", step);
  fflush(NULL);
  hash(&k,sizeof(k),s,&l);
  for(unsigned i=1; i<=mx; i+=step){
    hash(&k,sizeof(k),i,&h);
    x = popcount8(l^h);
    x = x*x*x*x*x;
    sb+=x; sbb+=x*x; l=h;
  }
  sb/=n; sbb=(sbb/n-sb*sb)/n;

  double chi2=(sa-sb)*(sa-sb)/(saa+sbb);
  printf("%Lf - %Lf\nKeySeedMomentChi2:\t%g\t", sb, sbb, chi2);
  fflush(NULL);
  if (chi2 > 3.84145882069413)
  {
    printf("FAIL!!!!\n");
    fflush(NULL);
    return false;
  }
  else
  {
    printf("PASS\n");
    fflush(NULL);
    return true;
  }
}